

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O2

void __thiscall Memory::Recycler::PrintMarkCollectionStats(Recycler *this)

{
  ulong uVar1;
  size_t sVar2;
  size_t sVar3;
  ulong uVar4;
  size_t sVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  double dVar19;
  double dVar20;
  undefined1 auVar21 [16];
  double dVar24;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  
  sVar2 = (this->collectionStats).markData.markCount;
  lVar8 = ((this->collectionStats).tryMarkInteriorCount + (this->collectionStats).tryMarkCount) -
          ((this->collectionStats).remarkCount + sVar2);
  lVar7 = lVar8 - ((this->collectionStats).tryMarkNullCount +
                   (this->collectionStats).tryMarkUnalignedCount +
                   (this->collectionStats).tryMarkNonRecyclerMemoryCount +
                   (this->collectionStats).tryMarkInteriorNonRecyclerMemoryCount +
                  (this->collectionStats).tryMarkInteriorNullCount);
  lVar6 = sVar2 - (this->collectionStats).scanCount;
  Output::Print(
               L"---------------------------------------------------------------------------------------------------------------\n"
               );
  Output::Print(L"Try Mark    :%9s %5s %10s | Non-Mark  : %9s %5s | Mark    :%9s %5s \n",L"Count",
                L"%",L"Bytes",L"Count",L"%");
  Output::Print(
               L"---------------------------------------------------------------------------------------------------------------\n"
               );
  sVar2 = (this->collectionStats).tryMarkNullCount;
  auVar14._8_4_ = (int)(sVar2 >> 0x20);
  auVar14._0_8_ = sVar2;
  auVar14._12_4_ = 0x45300000;
  auVar21._8_4_ = (int)((ulong)lVar8 >> 0x20);
  auVar21._0_8_ = lVar8;
  auVar21._12_4_ = 0x45300000;
  dVar19 = (double)CONCAT44(0x43300000,(int)lVar8) - 4503599627370496.0;
  dVar24 = auVar21._8_8_ - 1.9342813113834067e+25;
  dVar20 = dVar19 + dVar24;
  dVar19 = dVar19 + dVar24;
  sVar3 = (this->collectionStats).tryMarkCount;
  uVar4 = (this->collectionStats).scanCount;
  uVar1 = (this->collectionStats).markData.markCount;
  auVar12._8_8_ = uVar1;
  auVar12._0_8_ = uVar4;
  auVar17 = pblendw(auVar12,ZEXT816(0),0xcc);
  Output::Print(L" TryMark    :%9d       %10d | Null      : %9d %5.1f | Scan    :%9d %5.1f\n",
                ((((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0) +
                 (auVar14._8_8_ - 1.9342813113834067e+25)) / dVar20) * 100.0,
                ((((double)(uVar4 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
                 SUB168(auVar17 | _DAT_00eb36e0,0)) /
                (((double)(uVar1 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
                SUB168(auVar17 | _DAT_00eb36e0,8))) * 100.0,sVar3,sVar3 * 8);
  sVar2 = (this->collectionStats).tryMarkCount;
  auVar22._8_4_ = (int)(sVar2 >> 0x20);
  auVar22._0_8_ = sVar2;
  auVar22._12_4_ = 0x45300000;
  sVar5 = (this->collectionStats).tryMarkUnalignedCount;
  auVar13._8_4_ = (int)(sVar5 >> 0x20);
  auVar13._0_8_ = sVar5;
  auVar13._12_4_ = 0x45300000;
  auVar18._8_4_ = (int)((ulong)lVar6 >> 0x20);
  auVar18._0_8_ = lVar6;
  auVar18._12_4_ = 0x45300000;
  sVar3 = (this->collectionStats).markData.markCount;
  auVar23._8_4_ = (int)(sVar3 >> 0x20);
  auVar23._0_8_ = sVar3;
  auVar23._12_4_ = 0x45300000;
  Output::Print(L"   Non-Mark :%9d %5.1f            | Unaligned : %9d %5.1f | Leaf    :%9d %5.1f\n",
                (dVar20 / (((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0) +
                          (auVar22._8_8_ - 1.9342813113834067e+25))) * 100.0,
                ((((double)CONCAT44(0x43300000,(int)sVar5) - 4503599627370496.0) +
                 (auVar13._8_8_ - 1.9342813113834067e+25)) / dVar20) * 100.0,
                ((((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0) +
                 (auVar18._8_8_ - 1.9342813113834067e+25)) /
                (((double)CONCAT44(0x43300000,(int)sVar3) - 4503599627370496.0) +
                (auVar23._8_8_ - 1.9342813113834067e+25))) * 100.0,lVar8,sVar5,lVar6);
  uVar4 = (this->collectionStats).markData.markCount;
  uVar1 = (this->collectionStats).tryMarkCount;
  auVar17._8_8_ = uVar1;
  auVar17._0_8_ = uVar4;
  auVar14 = pblendw(auVar17,_DAT_00de4b10,0xcc);
  sVar2 = (this->collectionStats).tryMarkNonRecyclerMemoryCount;
  auVar15._8_4_ = (int)(sVar2 >> 0x20);
  auVar15._0_8_ = sVar2;
  auVar15._12_4_ = 0x45300000;
  Output::Print(L"   Mark     :%9d %5.1f %10d | Non GC    : %9d %5.1f | Track   :%9d\n",
                ((((double)(uVar4 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
                 SUB168(auVar14 | _DAT_00eb36e0,0)) /
                (((double)(uVar1 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
                SUB168(auVar14 | _DAT_00eb36e0,8))) * 100.0,
                ((((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0) +
                 (auVar15._8_8_ - 1.9342813113834067e+25)) / dVar20) * 100.0,uVar4,
                (this->collectionStats).markData.markBytes,sVar2,(this->collectionStats).trackCount)
  ;
  uVar4 = (this->collectionStats).remarkCount;
  uVar1 = (this->collectionStats).tryMarkCount;
  auVar9._8_8_ = uVar1;
  auVar9._0_8_ = uVar4;
  auVar14 = pblendw((undefined1  [16])0x0,auVar9,0x33);
  auVar16._8_4_ = (int)((ulong)lVar7 >> 0x20);
  auVar16._0_8_ = lVar7;
  auVar16._12_4_ = 0x45300000;
  Output::Print(L"   Remark   :%9d %5.1f            | Invalid   : %9d %5.1f \n",
                ((((double)(uVar4 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
                 SUB168(auVar14 | _DAT_00eb36e0,0)) /
                (((double)(uVar1 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
                SUB168(auVar14 | _DAT_00eb36e0,8))) * 100.0,
                ((((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0) +
                 (auVar16._8_8_ - 1.9342813113834067e+25)) / dVar20) * 100.0,uVar4,lVar7);
  sVar2 = (this->collectionStats).tryMarkInteriorCount;
  sVar3 = (this->collectionStats).tryMarkInteriorNullCount;
  auVar10._8_4_ = (int)(sVar3 >> 0x20);
  auVar10._0_8_ = sVar3;
  auVar10._12_4_ = 0x45300000;
  Output::Print(L" TryMark Int:%9d       %10d | Null Int  : %9d %5.1f | Root    :%9d | New     :%9d\n"
                ,((((double)CONCAT44(0x43300000,(int)sVar3) - 4503599627370496.0) +
                  (auVar10._8_8_ - 1.9342813113834067e+25)) / dVar20) * 100.0,sVar2,sVar2 * 8,sVar3,
                (this->collectionStats).rootCount,(this->collectionStats).markThruNewObjCount,dVar20
                ,dVar19);
  sVar2 = (this->collectionStats).tryMarkInteriorNonRecyclerMemoryCount;
  auVar11._8_4_ = (int)(sVar2 >> 0x20);
  auVar11._0_8_ = sVar2;
  auVar11._12_4_ = 0x45300000;
  Output::Print(L"                                        | Non GC Int: %9d %5.1f | Stack   :%9d | NewFalse:%9d\n"
                ,((((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0) +
                  (auVar11._8_8_ - 1.9342813113834067e+25)) / dVar20) * 100.0,sVar2,
                (this->collectionStats).stackCount,(this->collectionStats).markThruFalseNewObjCount)
  ;
  return;
}

Assistant:

void
Recycler::PrintMarkCollectionStats()
{
    size_t nonMark = collectionStats.tryMarkCount + collectionStats.tryMarkInteriorCount - collectionStats.remarkCount - collectionStats.markData.markCount;
    size_t invalidCount = nonMark - collectionStats.tryMarkNullCount - collectionStats.tryMarkUnalignedCount
        - collectionStats.tryMarkNonRecyclerMemoryCount
        - collectionStats.tryMarkInteriorNonRecyclerMemoryCount
        - collectionStats.tryMarkInteriorNullCount;
    size_t leafCount = collectionStats.markData.markCount - collectionStats.scanCount;
    Output::Print(_u("---------------------------------------------------------------------------------------------------------------\n"));
    Output::Print(_u("Try Mark    :%9s %5s %10s | Non-Mark  : %9s %5s | Mark    :%9s %5s \n"), _u("Count"), _u("%"), _u("Bytes"), _u("Count"), _u("%"), _u("Count"), _u("%"));
    Output::Print(_u("---------------------------------------------------------------------------------------------------------------\n"));
    Output::Print(_u(" TryMark    :%9d       %10d | Null      : %9d %5.1f | Scan    :%9d %5.1f\n"),
        collectionStats.tryMarkCount, collectionStats.tryMarkCount * sizeof(void *),
        collectionStats.tryMarkNullCount, (double)collectionStats.tryMarkNullCount / (double)nonMark * 100,
        collectionStats.scanCount, (double)collectionStats.scanCount / (double)collectionStats.markData.markCount * 100);
    Output::Print(_u("   Non-Mark :%9d %5.1f            | Unaligned : %9d %5.1f | Leaf    :%9d %5.1f\n"),
        nonMark, (double)nonMark / (double)collectionStats.tryMarkCount * 100,
        collectionStats.tryMarkUnalignedCount, (double)collectionStats.tryMarkUnalignedCount / (double)nonMark * 100,
        leafCount, (double)leafCount / (double)collectionStats.markData.markCount * 100);
    Output::Print(_u("   Mark     :%9d %5.1f %10d | Non GC    : %9d %5.1f | Track   :%9d\n"),
        collectionStats.markData.markCount, (double)collectionStats.markData.markCount / (double)collectionStats.tryMarkCount * 100, collectionStats.markData.markBytes,
        collectionStats.tryMarkNonRecyclerMemoryCount, (double)collectionStats.tryMarkNonRecyclerMemoryCount / (double)nonMark * 100,
        collectionStats.trackCount);
    Output::Print(_u("   Remark   :%9d %5.1f            | Invalid   : %9d %5.1f \n"),
        collectionStats.remarkCount, (double)collectionStats.remarkCount / (double)collectionStats.tryMarkCount * 100,
        invalidCount, (double)invalidCount / (double)nonMark * 100);
    Output::Print(_u(" TryMark Int:%9d       %10d | Null Int  : %9d %5.1f | Root    :%9d | New     :%9d\n"),
        collectionStats.tryMarkInteriorCount, collectionStats.tryMarkInteriorCount * sizeof(void *),
        collectionStats.tryMarkInteriorNullCount, (double)collectionStats.tryMarkInteriorNullCount / (double)nonMark * 100,
        collectionStats.rootCount, collectionStats.markThruNewObjCount);
    Output::Print(_u("                                        | Non GC Int: %9d %5.1f | Stack   :%9d | NewFalse:%9d\n"),
        collectionStats.tryMarkInteriorNonRecyclerMemoryCount, (double)collectionStats.tryMarkInteriorNonRecyclerMemoryCount / (double)nonMark * 100,
        collectionStats.stackCount, collectionStats.markThruFalseNewObjCount);
}